

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deCommandLine.c
# Opt level: O1

void deCommandLine_selfTest(void)

{
  char *ref [1];
  char *local_10;
  
  local_10 = "hello";
  testParse("hello",&local_10,1);
  testParse("hello world",&PTR_anon_var_dwarf_260d584_00d4bc00,2);
  local_10 = "hello/world";
  testParse("hello/world",&local_10,1);
  testParse("hello/world --help",&PTR_anon_var_dwarf_260d5c2_00d4bc10,2);
  testParse("hello/world --help foo",(char **)&DAT_00d4bc20,3);
  testParse("hello\\world --help foo",(char **)&DAT_00d4bc40,3);
  testParse("\"hello/worl d\" --help --foo=\"bar\" \"ba z\\\"\"",(char **)&DAT_00d4bc60,4);
  testParse("\'hello/worl d\' --help --foo=\'bar\' \'ba z\\\'\'",(char **)&DAT_00d4bc80,4);
  testParse("hello \"\'world\'\"",&PTR_anon_var_dwarf_260d584_00d4bca0,2);
  testParse("hello \'\"world\"\'",&PTR_anon_var_dwarf_260d584_00d4bcb0,2);
  testParse("hello \"world\\n\"",&PTR_anon_var_dwarf_260d584_00d4bcc0,2);
  return;
}

Assistant:

void deCommandLine_selfTest (void)
{
	{
		const char* cmdLine	= "hello";
		const char* ref[]	= { "hello" };
		testParse(cmdLine, ref, DE_LENGTH_OF_ARRAY(ref));
	}
	{
		const char* cmdLine	= "hello world";
		const char* ref[]	= { "hello", "world" };
		testParse(cmdLine, ref, DE_LENGTH_OF_ARRAY(ref));
	}
	{
		const char* cmdLine	= "hello/world";
		const char* ref[]	= { "hello/world" };
		testParse(cmdLine, ref, DE_LENGTH_OF_ARRAY(ref));
	}
	{
		const char* cmdLine	= "hello/world --help";
		const char* ref[]	= { "hello/world", "--help" };
		testParse(cmdLine, ref, DE_LENGTH_OF_ARRAY(ref));
	}
	{
		const char* cmdLine	= "hello/world --help foo";
		const char* ref[]	= { "hello/world", "--help", "foo" };
		testParse(cmdLine, ref, DE_LENGTH_OF_ARRAY(ref));
	}
	{
		const char* cmdLine	= "hello\\world --help foo";
		const char* ref[]	= { "hello\\world", "--help", "foo" };
		testParse(cmdLine, ref, DE_LENGTH_OF_ARRAY(ref));
	}
	{
		const char* cmdLine	= "\"hello/worl d\" --help --foo=\"bar\" \"ba z\\\"\"";
		const char* ref[]	= { "hello/worl d", "--help", "--foo=bar", "ba z\"" };
		testParse(cmdLine, ref, DE_LENGTH_OF_ARRAY(ref));
	}
	{
		const char* cmdLine	= "'hello/worl d' --help --foo='bar' 'ba z\\\''";
		const char* ref[]	= { "hello/worl d", "--help", "--foo=bar", "ba z'" };
		testParse(cmdLine, ref, DE_LENGTH_OF_ARRAY(ref));
	}
	{
		const char* cmdLine	= "hello \"'world'\"";
		const char* ref[]	= { "hello", "'world'" };
		testParse(cmdLine, ref, DE_LENGTH_OF_ARRAY(ref));
	}
	{
		const char* cmdLine	= "hello '\"world\"'";
		const char* ref[]	= { "hello", "\"world\"" };
		testParse(cmdLine, ref, DE_LENGTH_OF_ARRAY(ref));
	}
	{
		const char* cmdLine	= "hello \"world\\n\"";
		const char* ref[]	= { "hello", "world\n" };
		testParse(cmdLine, ref, DE_LENGTH_OF_ARRAY(ref));
	}
}